

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

size_t fctkern__chk_cnt(fctkern_t *nk)

{
  size_t sVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x902
                  ,"size_t fctkern__chk_cnt(const fctkern_t *)");
  }
  sVar1 = (nk->ts_list).used_itm_num;
  if (sVar1 == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    sVar5 = 0;
    do {
      pvVar2 = (nk->ts_list).itm_list[sVar5];
      if (pvVar2 == (void *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x53f,"size_t fct_ts__chk_cnt(const fct_ts_t *)");
      }
      if (*(long *)((long)pvVar2 + 0x120) == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        lVar7 = 0;
        do {
          lVar3 = *(long *)(*(long *)((long)pvVar2 + 0x110) + lVar7 * 8);
          if (lVar3 == 0) {
            __assert_fail("test != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x41b,"size_t fct_test__chk_cnt(const fct_test_t *)");
          }
          lVar6 = lVar6 + *(long *)(lVar3 + 0x10) + *(long *)(lVar3 + 0x28);
          lVar7 = lVar7 + 1;
        } while (*(long *)((long)pvVar2 + 0x120) != lVar7);
      }
      sVar4 = sVar4 + lVar6;
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar1);
  }
  return sVar4;
}

Assistant:

static size_t
fctkern__chk_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );

    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__chk_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}